

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O2

vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> * __thiscall
HBF::expand(vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *__return_storage_ptr__,HBF *this,
           maze_s state)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double __x;
  value_type local_38;
  
  (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (dVar4 = -35.0; dVar4 < 40.0; dVar4 = dVar4 + 5.0) {
    dVar1 = this->SPEED;
    dVar2 = this->LENGTH;
    dVar3 = tan(dVar4 * 0.017453292519943295);
    dVar1 = dVar3 * (dVar1 / dVar2) + state.theta;
    __x = (double)(~-(ulong)(0.0 < dVar1) & (ulong)dVar1 |
                  (ulong)(dVar1 + 6.283185307179586) & -(ulong)(0.0 < dVar1));
    dVar5 = this->SPEED;
    dVar2 = cos(__x);
    dVar1 = this->SPEED;
    dVar3 = sin(__x);
    local_38.x = dVar2 * dVar5 + state.x;
    local_38.y = dVar3 * dVar1 + state.y;
    local_38.g = (double)((int)state.g + 1);
    local_38.theta = __x;
    std::vector<HBF::maze_s,_std::allocator<HBF::maze_s>_>::push_back
              (__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<HBF::maze_s> HBF::expand(HBF::maze_s state) {
    int g = state.g;
    double x = state.x;
    double y = state.y;
    double theta = state.theta;

    int g2 = g + 1;
    vector<HBF::maze_s> next_states;
    for (double delta_i = -35; delta_i < 40; delta_i += 5) {

        double delta = M_PI / 180.0 * delta_i;
        double omega = SPEED / LENGTH * tan(delta);
        double theta2 = theta + omega;
        if (theta2 > 0) {
            theta2 += 2 * M_PI;
        }
        double x2 = x + SPEED * cos(theta2);
        double y2 = y + SPEED * sin(theta2);
        HBF::maze_s state2;
        state2.g = g2;
        state2.x = x2;
        state2.y = y2;
        state2.theta = theta2;
        next_states.push_back(state2);

    }
    return next_states;
}